

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QRect>::resize(QList<QRect> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QRect> *in_RSI;
  QArrayDataPointer<QRect> *in_RDI;
  QList<QRect> *unaff_retaddr;
  QArrayDataPointer<QRect> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QRect>::size((QList<QRect> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QRect>::operator->(in_RDI);
    QArrayDataPointer<QRect>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }